

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icosahedron.h
# Opt level: O0

void icosahedron<Eigen::Matrix<float,_1,3,1,_1,3>,Eigen::Matrix<unsigned_int,_1,3,1,_1,3>>
               (PlainObjectBase<Eigen::Matrix<float,__1,_3,_1,__1,_3>_> *V,
               PlainObjectBase<Eigen::Matrix<unsigned_int,__1,_3,_1,__1,_3>_> *F)

{
  CommaInitializer<Eigen::Matrix<float,__1,_3,_1,__1,_3>_> *pCVar1;
  PlainObjectBase<Eigen::Matrix<float,__1,_3,_1,__1,_3>_> *other;
  CommaInitializer<Eigen::Matrix<unsigned_int,__1,_3,_1,__1,_3>_> *pCVar2;
  PlainObjectBase<Eigen::Matrix<unsigned_int,__1,_3,_1,__1,_3>_> *other_00;
  Scalar local_218 [59];
  Scalar local_12c [3];
  Matrix<unsigned_int,__1,_3,_1,__1,_3> local_120;
  CommaInitializer<Eigen::Matrix<unsigned_int,__1,_3,_1,__1,_3>_> local_110;
  Scalar local_f0;
  Scalar local_ec;
  Scalar local_e8;
  Scalar local_e4;
  Scalar local_e0;
  Scalar local_dc;
  Scalar local_d8;
  Scalar local_d4;
  Scalar local_d0;
  Scalar local_cc;
  Scalar local_c8;
  Scalar local_c4;
  Scalar local_c0;
  Scalar local_bc;
  Scalar local_b8;
  Scalar local_b4;
  Scalar local_b0;
  Scalar local_ac;
  Scalar local_a8;
  Scalar local_a4;
  Scalar local_a0;
  Scalar local_9c;
  Scalar local_98;
  Scalar local_94;
  Scalar local_90;
  Scalar local_8c;
  Scalar local_88;
  Scalar local_84;
  Scalar local_80;
  Scalar local_7c;
  Scalar local_78;
  Scalar local_74;
  Scalar local_70;
  Scalar local_6c;
  Scalar local_68 [5];
  Scalar local_54;
  int local_50 [2];
  Matrix<float,__1,_3,_1,__1,_3> local_48;
  CommaInitializer<Eigen::Matrix<float,__1,_3,_1,__1,_3>_> local_38;
  PlainObjectBase<Eigen::Matrix<unsigned_int,__1,_3,_1,__1,_3>_> *local_18;
  PlainObjectBase<Eigen::Matrix<unsigned_int,__1,_3,_1,__1,_3>_> *F_local;
  PlainObjectBase<Eigen::Matrix<float,__1,_3,_1,__1,_3>_> *V_local;
  
  local_50[1] = 0xc;
  local_50[0] = 3;
  local_18 = F;
  F_local = (PlainObjectBase<Eigen::Matrix<unsigned_int,__1,_3,_1,__1,_3>_> *)V;
  Eigen::Matrix<float,-1,3,1,-1,3>::Matrix<int,int>
            ((Matrix<float,_1,3,1,_1,3> *)&local_48,local_50 + 1,local_50);
  local_54 = 0.0;
  Eigen::DenseBase<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator<<
            (&local_38,(DenseBase<Eigen::Matrix<float,__1,_3,_1,__1,_3>_> *)&local_48,&local_54);
  local_68[0] = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (&local_38,local_68);
  local_6c = 1.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_6c);
  local_70 = 0.7236068;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_70);
  local_74 = -0.5257311;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_74);
  local_78 = 0.4472136;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_78);
  local_7c = 0.7236068;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_7c);
  local_80 = 0.5257311;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_80);
  local_84 = 0.4472136;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_84);
  local_88 = -0.2763932;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_88);
  local_8c = 0.8506508;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_8c);
  local_90 = 0.4472136;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_90);
  local_94 = -0.8944272;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_94);
  local_98 = 1.0953574e-16;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_98);
  local_9c = 0.4472136;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_9c);
  local_a0 = -0.2763932;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_a0);
  local_a4 = -0.8506508;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_a4);
  local_a8 = 0.4472136;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_a8);
  local_ac = 0.8944272;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_ac);
  local_b0 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_b0);
  local_b4 = -0.4472136;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_b4);
  local_b8 = 0.2763932;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_b8);
  local_bc = 0.8506508;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_bc);
  local_c0 = -0.4472136;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_c0);
  local_c4 = -0.7236068;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_c4);
  local_c8 = 0.5257311;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_c8);
  local_cc = -0.4472136;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_cc);
  local_d0 = -0.7236068;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_d0);
  local_d4 = -0.5257311;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_d4);
  local_d8 = -0.4472136;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_d8);
  local_dc = 0.2763932;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_dc);
  local_e0 = -0.8506508;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_e0);
  local_e4 = -0.4472136;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_e4);
  local_e8 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_e8);
  local_ec = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_ec);
  local_f0 = -1.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_f0);
  other = &Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::finished(pCVar1)->
           super_PlainObjectBase<Eigen::Matrix<float,__1,_3,_1,__1,_3>_>;
  Eigen::PlainObjectBase<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator=
            ((PlainObjectBase<Eigen::Matrix<float,__1,_3,_1,__1,_3>_> *)F_local,other);
  Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::~CommaInitializer(&local_38);
  Eigen::Matrix<float,_-1,_3,_1,_-1,_3>::~Matrix(&local_48);
  local_12c[2] = 0x14;
  local_12c[1] = 3;
  Eigen::Matrix<unsigned_int,-1,3,1,-1,3>::Matrix<int,int>
            ((Matrix<unsigned_int,_1,3,1,_1,3> *)&local_120,(int *)(local_12c + 2),
             (int *)(local_12c + 1));
  local_12c[0] = 0;
  Eigen::DenseBase<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator<<
            (&local_110,(DenseBase<Eigen::Matrix<unsigned_int,__1,_3,_1,__1,_3>_> *)&local_120,
             local_12c);
  local_218[0x3a] = 1;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (&local_110,local_218 + 0x3a);
  local_218[0x39] = 2;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 0x39);
  local_218[0x38] = 0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 0x38);
  local_218[0x37] = 2;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 0x37);
  local_218[0x36] = 3;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 0x36);
  local_218[0x35] = 0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 0x35);
  local_218[0x34] = 3;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 0x34);
  local_218[0x33] = 4;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 0x33);
  local_218[0x32] = 0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 0x32);
  local_218[0x31] = 4;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 0x31);
  local_218[0x30] = 5;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 0x30);
  local_218[0x2f] = 0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 0x2f);
  local_218[0x2e] = 5;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 0x2e);
  local_218[0x2d] = 1;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 0x2d);
  local_218[0x2c] = 1;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 0x2c);
  local_218[0x2b] = 6;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 0x2b);
  local_218[0x2a] = 2;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 0x2a);
  local_218[0x29] = 2;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 0x29);
  local_218[0x28] = 7;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 0x28);
  local_218[0x27] = 3;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 0x27);
  local_218[0x26] = 3;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 0x26);
  local_218[0x25] = 8;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 0x25);
  local_218[0x24] = 4;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 0x24);
  local_218[0x23] = 4;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 0x23);
  local_218[0x22] = 9;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 0x22);
  local_218[0x21] = 5;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 0x21);
  local_218[0x20] = 5;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 0x20);
  local_218[0x1f] = 10;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 0x1f);
  local_218[0x1e] = 1;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 0x1e);
  local_218[0x1d] = 6;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 0x1d);
  local_218[0x1c] = 7;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 0x1c);
  local_218[0x1b] = 2;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 0x1b);
  local_218[0x1a] = 7;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 0x1a);
  local_218[0x19] = 8;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 0x19);
  local_218[0x18] = 3;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 0x18);
  local_218[0x17] = 8;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 0x17);
  local_218[0x16] = 9;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 0x16);
  local_218[0x15] = 4;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 0x15);
  local_218[0x14] = 9;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 0x14);
  local_218[0x13] = 10;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 0x13);
  local_218[0x12] = 5;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 0x12);
  local_218[0x11] = 10;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 0x11);
  local_218[0x10] = 6;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 0x10);
  local_218[0xf] = 1;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 0xf);
  local_218[0xe] = 6;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 0xe);
  local_218[0xd] = 0xb;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 0xd);
  local_218[0xc] = 7;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 0xc);
  local_218[0xb] = 7;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 0xb);
  local_218[10] = 0xb;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 10);
  local_218[9] = 8;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 9);
  local_218[8] = 8;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 8);
  local_218[7] = 0xb;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 7);
  local_218[6] = 9;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 6);
  local_218[5] = 9;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 5);
  local_218[4] = 0xb;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 4);
  local_218[3] = 10;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 3);
  local_218[2] = 10;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 2);
  local_218[1] = 0xb;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218 + 1);
  local_218[0] = 6;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_218);
  other_00 = &Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::finished
                        (pCVar2)->
              super_PlainObjectBase<Eigen::Matrix<unsigned_int,__1,_3,_1,__1,_3>_>;
  Eigen::PlainObjectBase<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator=
            (local_18,other_00);
  Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::~CommaInitializer
            (&local_110);
  Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>::~Matrix(&local_120);
  return;
}

Assistant:

inline void icosahedron(
  Eigen::PlainObjectBase<DerivedV> & V,
  Eigen::PlainObjectBase<DerivedF> & F)
{
  V = (DerivedV(12,3) <<
    0,0,1,
    0.72360679774997894,-0.52573111211913359,0.44721359549995793,
    0.72360679774997894,0.52573111211913359,0.44721359549995793,
    -0.27639320225002095,0.85065080835203999,0.44721359549995793,
    -0.89442719099991586,1.0953573965284052e-16,0.44721359549995793,
    -0.27639320225002112,-0.85065080835203988,0.44721359549995793,
    0.89442719099991586,0,-0.44721359549995793,
    0.27639320225002106,0.85065080835203988,-0.44721359549995793,
    -0.72360679774997883,0.5257311121191337,-0.44721359549995793,
    -0.72360679774997894,-0.52573111211913348,-0.44721359549995793,
    0.27639320225002084,-0.85065080835203999,-0.44721359549995793,
    0,0,-1).finished();
  F = (DerivedF(20,3)<<
    0,1,2,
    0,2,3,
    0,3,4,
    0,4,5,
    0,5,1,
    1,6,2,
    2,7,3,
    3,8,4,
    4,9,5,
    5,10,1,
    6,7,2,
    7,8,3,
    8,9,4,
    9,10,5,
    10,6,1,
    6,11,7,
    7,11,8,
    8,11,9,
    9,11,10,
    10,11,6).finished();
}